

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambdamember.cpp
# Opt level: O2

PyObject * PyInit_member(void)

{
  handle obj;
  handle hVar1;
  int iVar2;
  undefined8 uVar3;
  class_<SomeClass> *this;
  object_api<pybind11::handle> *this_00;
  function_record *rec;
  handle local_90;
  cpp_function cf;
  class_<SomeClass> local_80;
  cpp_function local_78;
  module m;
  int minor;
  int major;
  object local_60;
  obj_attr_accessor local_58;
  code *local_30;
  undefined8 local_28;
  
  uVar3 = Py_GetVersion();
  iVar2 = __isoc99_sscanf(uVar3,"%i.%i",&major,&minor);
  if (iVar2 == 2) {
    if (minor == 10 && major == 3) {
      pybind11::module::module
                (&m,"lambdamember","pybind11 member class with lambda function example");
      pybind11::class_<SomeClass>::class_<>
                (&local_80,(handle)m.super_object.super_handle.m_ptr,"SomeClass");
      pybind11::detail::
      init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      execute<pybind11::class_<SomeClass>,_0>(&local_80);
      this = pybind11::class_<SomeClass>::def_readwrite<SomeClass,std::__cxx11::string>
                       (&local_80,"name",0);
      local_30 = SomeClass::getNumber;
      local_28 = 0;
      pybind11::cpp_function::cpp_function<void,SomeClass,double>
                (&local_78,(offset_in_SomeClass_to_subr)SomeClass::setNumber);
      this_00 = (object_api<pybind11::handle> *)
                pybind11::class_<SomeClass>::def_property<double(SomeClass::*)()const>
                          (this,"number",(offset_in_SomeClass_to_subr *)&local_30,&local_78);
      obj.m_ptr = *(PyObject **)this_00;
      local_60.super_handle.m_ptr = (handle)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
      pybind11::getattr((pybind11 *)&local_90,obj,"__repr__",(PyObject *)&_Py_NoneStruct);
      hVar1.m_ptr = local_90.m_ptr;
      cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
      rec = pybind11::cpp_function::make_function_record(&cf);
      rec->impl = pybind11::cpp_function::
                  initialize<pybind11_init()::$_0,std::__cxx11::string,SomeClass_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(pybind11_init()::$_0&&,std::__cxx11::string(*)(SomeClass_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
                  ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
      rec->name = "__repr__";
      rec->field_0x59 = rec->field_0x59 | 0x20;
      (rec->scope).m_ptr = obj.m_ptr;
      (rec->sibling).m_ptr = hVar1.m_ptr;
      local_58.key.super_handle.m_ptr = (handle)&SomeClass::typeinfo;
      local_58.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_58._0_1_ = '(';
      local_58._1_1_ = '{';
      local_58._2_1_ = '%';
      local_58._3_1_ = '}';
      local_58._4_1_ = ')';
      local_58._5_1_ = ' ';
      local_58._6_1_ = '-';
      local_58._7_1_ = '>';
      local_58.obj.m_ptr = (PyObject *)0x7d7274737b20;
      pybind11::cpp_function::initialize_generic
                (&cf,rec,(char *)&local_58,(type_info **)&local_58.key,1);
      pybind11::object::~object((object *)&local_90);
      pybind11::object::~object(&local_60);
      pybind11::cpp_function::name((cpp_function *)&local_90);
      pybind11::detail::object_api<pybind11::handle>::attr(&local_58,this_00,local_90);
      pybind11::detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
                (&local_58,&cf);
      pybind11::detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor
                (&local_58);
      pybind11::object::~object((object *)&local_90);
      pybind11::object::~object((object *)&cf);
      pybind11::object::~object((object *)&local_78);
      pybind11::object::~object((object *)&local_80);
      pybind11::object::~object(&m.super_object);
    }
    else {
      PyErr_Format(_PyExc_ImportError,
                   "Python version mismatch: module was compiled for version %i.%i, while the interpreter is running version %i.%i."
                   ,3,10);
      m.super_object.super_handle.m_ptr = (object)(object)(PyObject *)0x0;
    }
  }
  else {
    PyErr_SetString(_PyExc_ImportError,"Can\'t parse Python version.");
    m.super_object.super_handle.m_ptr = (object)(handle)0x0;
  }
  return (PyObject *)m.super_object.super_handle.m_ptr;
}

Assistant:

PYBIND11_PLUGIN(member)
{
    py::module m("lambdamember","pybind11 member class with lambda function example");

    py::class_<SomeClass>( m, "SomeClass")
        .def(py::init<std::string>())
        .def_readwrite("name", & SomeClass::name)
        .def_property("number", &SomeClass::getNumber, &SomeClass::setNumber)
        .def("__repr__",
            [](const SomeClass &a) {
            return "<example.SomeClass named '" + a.name + "'>";
            });
    ;
    return m.ptr();

}